

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::rg(AbstractContentContext *this,double inR,double inG,double inB)

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  allocator<char> local_51;
  double local_50;
  double local_48;
  double local_40;
  string local_38;
  
  local_50 = inR;
  local_48 = inG;
  local_40 = inB;
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteDouble(this_00,local_50,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_48,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_40,eTokenSeparatorSpace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"rg",&local_51);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::rg(double inR,double inG,double inB)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteDouble(inR);
	mPrimitiveWriter.WriteDouble(inG);
	mPrimitiveWriter.WriteDouble(inB);
	mPrimitiveWriter.WriteKeyword("rg");
	return GetCurrentStatusCode();
}